

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3CodeRowTrigger
               (Parse *pParse,Trigger *pTrigger,int op,ExprList *pChanges,int tr_tm,Table *pTab,
               int reg,int orconf,int ignoreJump)

{
  int iVar1;
  undefined8 in_RCX;
  uint in_EDX;
  Table *in_RSI;
  Trigger *in_RDI;
  uint in_R8D;
  ExprList *in_R9;
  Trigger *p;
  undefined4 in_stack_00000010;
  Table *local_38;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffe8;
  
  for (local_38 = in_RSI; local_38 != (Table *)0x0; local_38 = *(Table **)&local_38->u) {
    if (((*(byte *)&local_38->pIndex == in_EDX) ||
        (((*(char *)((long)&local_38->pIndex + 2) != '\0' && (*(char *)&local_38->pIndex == -0x80))
         && (in_EDX == 0x82)))) &&
       ((*(byte *)((long)&local_38->pIndex + 1) == in_R8D &&
        (iVar1 = checkColumnOverlap((IdList *)CONCAT44(in_R8D,in_stack_ffffffffffffffd8),in_R9),
        iVar1 != 0)))) {
      if (*(char *)((long)&local_38->pIndex + 2) == '\0') {
        sqlite3CodeRowTriggerDirect
                  ((Parse *)p,in_RDI,in_RSI,in_EDX,in_stack_ffffffffffffffe8,
                   (int)((ulong)in_RCX >> 0x20));
      }
      else if (in_RDI[2].pColumns == (IdList *)0x0) {
        codeReturningTrigger
                  ((Parse *)CONCAT44(tr_tm,in_stack_00000010),(Trigger *)pTab,(Table *)p,
                   (int)((ulong)in_RDI >> 0x20));
      }
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3CodeRowTrigger(
  Parse *pParse,       /* Parse context */
  Trigger *pTrigger,   /* List of triggers on table pTab */
  int op,              /* One of TK_UPDATE, TK_INSERT, TK_DELETE */
  ExprList *pChanges,  /* Changes list for any UPDATE OF triggers */
  int tr_tm,           /* One of TRIGGER_BEFORE, TRIGGER_AFTER */
  Table *pTab,         /* The table to code triggers from */
  int reg,             /* The first in an array of registers (see above) */
  int orconf,          /* ON CONFLICT policy */
  int ignoreJump       /* Instruction to jump to for RAISE(IGNORE) */
){
  Trigger *p;          /* Used to iterate through pTrigger list */

  assert( op==TK_UPDATE || op==TK_INSERT || op==TK_DELETE );
  assert( tr_tm==TRIGGER_BEFORE || tr_tm==TRIGGER_AFTER );
  assert( (op==TK_UPDATE)==(pChanges!=0) );

  for(p=pTrigger; p; p=p->pNext){

    /* Sanity checking:  The schema for the trigger and for the table are
    ** always defined.  The trigger must be in the same schema as the table
    ** or else it must be a TEMP trigger. */
    assert( p->pSchema!=0 );
    assert( p->pTabSchema!=0 );
    assert( p->pSchema==p->pTabSchema
         || p->pSchema==pParse->db->aDb[1].pSchema );

    /* Determine whether we should code this trigger.  One of two choices:
    **   1. The trigger is an exact match to the current DML statement
    **   2. This is a RETURNING trigger for INSERT but we are currently
    **      doing the UPDATE part of an UPSERT.
    */
    if( (p->op==op || (p->bReturning && p->op==TK_INSERT && op==TK_UPDATE))
     && p->tr_tm==tr_tm
     && checkColumnOverlap(p->pColumns, pChanges)
    ){
      if( !p->bReturning ){
        sqlite3CodeRowTriggerDirect(pParse, p, pTab, reg, orconf, ignoreJump);
      }else if( sqlite3IsToplevel(pParse) ){
        codeReturningTrigger(pParse, p, pTab, reg);
      }
    }
  }
}